

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

Value * __thiscall
GlobOpt::ValueNumberDst(GlobOpt *this,Instr **pInstr,Value *src1Val,Value *src2Val)

{
  OpCode OVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  BVIndex i;
  Opnd *this_00;
  Opnd *this_01;
  ObjectSymInfo *pOVar5;
  BasicBlock *pBVar6;
  ValueInfo *valueInfo;
  Sym *pSVar7;
  code *pcVar8;
  bool bVar9;
  OpndKind OVar10;
  BOOLEAN BVar11;
  ValueType VVar12;
  uint sourceContextId;
  uint functionId;
  BailOutKind BVar13;
  uint uVar14;
  undefined4 *puVar15;
  IntConstantBounds IVar16;
  ValueType *pVVar17;
  StackSym *pSVar18;
  ProfiledInstr *pPVar19;
  RegOpnd *pRVar20;
  JITTimeFunctionBody *this_02;
  FunctionJITTimeInfo *this_03;
  IndirOpnd *pIVar21;
  Value *pVVar22;
  SymOpnd *symOpnd;
  Value *pVVar23;
  Instr *pIVar24;
  GlobOpt *pGVar25;
  _func_int **pp_Var26;
  PropertySym *pPVar27;
  BailOutKind bailOutKind;
  GlobOpt *pGVar28;
  BVSparse<Memory::JitArenaAllocator> **ppBVar29;
  Value *val;
  bool bVar30;
  uint local_64;
  int local_60;
  int32 newMax;
  int32 min2;
  int32 max2;
  uint local_50;
  uint local_4c;
  int32 max1;
  int32 min1;
  undefined1 local_40 [8];
  int32 newMin;
  
  this_00 = (*pInstr)->m_dst;
  _max1 = src1Val;
  bVar9 = IR::Instr::CallsSetter(*pInstr);
  if (this_00 == (Opnd *)0x0 || bVar9) {
    return (Value *)0x0;
  }
  OVar10 = IR::Opnd::GetKind(this_00);
  if (OVar10 == OpndKindReg) {
    OVar10 = IR::Opnd::GetKind(this_00);
    if (OVar10 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar9) goto LAB_004556e6;
      *puVar15 = 0;
    }
    pp_Var26 = this_00[1]._vptr_Opnd;
    bVar9 = OpCodeAttr::TempNumberProducing((*pInstr)->m_opcode);
    if (bVar9) {
LAB_004540f5:
      BVSparse<Memory::JitArenaAllocator>::Set
                ((this->currentBlock->globOptData).isTempSrc,*(BVIndex *)(pp_Var26 + 2));
    }
    else {
      bVar9 = OpCodeAttr::TempNumberTransfer((*pInstr)->m_opcode);
      if (bVar9) {
        this_01 = (*pInstr)->m_src1;
        _newMin = this;
        OVar10 = IR::Opnd::GetKind(this_01);
        this = _newMin;
        if (OVar10 == OpndKindReg) {
          _min2 = (GlobOpt *)(_newMin->currentBlock->globOptData).isTempSrc;
          OVar10 = IR::Opnd::GetKind(this_01);
          if (OVar10 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar15 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
            if (!bVar9) goto LAB_004556e6;
            *puVar15 = 0;
          }
          BVar11 = BVSparse<Memory::JitArenaAllocator>::Test
                             ((BVSparse<Memory::JitArenaAllocator> *)_min2,
                              *(BVIndex *)(this_01[1]._vptr_Opnd + 2));
          this = _newMin;
          if (BVar11 != '\0') {
            pRVar20 = IR::Opnd::AsRegOpnd(this_01);
            pIVar24 = (pRVar20->m_sym->field_5).m_instrDef;
            if ((((pIVar24 != (Instr *)0x0 & pRVar20->m_sym->field_0x18) == 1) &&
                (OVar1 = pIVar24->m_opcode, OVar1 != Add_A)) &&
               (bVar9 = OpCodeAttr::TempNumberProducing(OVar1), this = _newMin, bVar9))
            goto LAB_004540f5;
            this = _newMin;
            _min2 = (GlobOpt *)(_newMin->currentBlock->globOptData).isTempSrc;
            pRVar20 = IR::Opnd::AsRegOpnd(this_01);
            BVSparse<Memory::JitArenaAllocator>::Clear
                      ((BVSparse<Memory::JitArenaAllocator> *)_min2,(pRVar20->m_sym->super_Sym).m_id
                      );
          }
        }
      }
      BVSparse<Memory::JitArenaAllocator>::Clear
                ((this->currentBlock->globOptData).isTempSrc,*(BVIndex *)(pp_Var26 + 2));
    }
  }
  else {
    if (OVar10 != OpndKindSym) {
      return (Value *)0x0;
    }
    OVar10 = IR::Opnd::GetKind(this_00);
    if (OVar10 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar9) goto LAB_004556e6;
      *puVar15 = 0;
    }
    pp_Var26 = this_00[1]._vptr_Opnd;
  }
  pVVar23 = _max1;
  if (_max1 == (Value *)0x0) {
    pGVar28 = (GlobOpt *)0x0;
  }
  else {
    pGVar28 = (GlobOpt *)_max1->valueInfo;
  }
  if (src2Val == (Value *)0x0) {
    pGVar25 = (GlobOpt *)0x0;
  }
  else {
    pGVar25 = (GlobOpt *)src2Val->valueInfo;
  }
  pIVar24 = *pInstr;
  OVar1 = pIVar24->m_opcode;
  pVVar22 = (Value *)0x0;
  val = (Value *)0x0;
  _newMin = this;
  if (StLocalSlot < OVar1) {
    if (OVar1 < Ld_I4) {
      if (NewRegEx < OVar1) {
        if (OVar1 < InitComputedProperty) {
          if (OVar1 == IsInst) {
switchD_004542a9_caseD_3b:
            pVVar17 = &ValueType::Boolean;
            goto LAB_004547b0;
          }
          if (OVar1 == BrOnEmpty) goto switchD_00454462_caseD_220;
          if (OVar1 == Conv_Str) goto switchD_00454462_caseD_228;
        }
        else {
          if (OVar1 - 0x1cf < 4) goto switchD_004542a9_caseD_3b;
          if (OVar1 == InitComputedProperty) goto switchD_004542a9_caseD_70;
        }
        goto switchD_004542a9_caseD_28;
      }
      switch(OVar1) {
      case LdElemI_A:
        pVVar23 = ValueNumberLdElemDst(this,pInstr,_max1);
        pIVar21 = IR::Opnd::AsIndirOpnd((*pInstr)->m_src1);
        local_40._0_2_ = (pIVar21->m_baseOpnd->super_Opnd).m_valueType.field_0.bits;
        bVar9 = ValueType::IsLikelyNativeArray((ValueType *)local_40);
        if (!bVar9) {
          return pVVar23;
        }
        pIVar24 = *pInstr;
        if (pIVar24->m_dst->m_type != TyVar) {
          return pVVar23;
        }
        break;
      case ProfiledLdElemI_A:
      case ProfiledStElemI_A:
        goto switchD_004542a9_caseD_28;
      case LdMethodElem:
        aVar2.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::GetObject(Object);
        local_40._0_2_ = aVar2.field_0;
        VVar12 = ValueType::ToLikely((ValueType *)local_40);
        pVVar23 = NewGenericValue(_newMin,VVar12,this_00);
        pIVar21 = IR::Opnd::AsIndirOpnd((*pInstr)->m_src1);
        local_40._0_2_ = (pIVar21->m_baseOpnd->super_Opnd).m_valueType.field_0.bits;
        bVar9 = ValueType::IsLikelyNativeArray((ValueType *)local_40);
        if (!bVar9) {
          return pVVar23;
        }
        pIVar24 = *pInstr;
        break;
      case StElemI_A:
      case StElemI_A_Strict:
        if (this->prePassLoop != (Loop *)0x0) goto LAB_0045520e;
        goto switchD_004543aa_caseD_1e5;
      default:
        switch(OVar1) {
        case LdLen_A:
          if (pIVar24->m_kind == InstrKindProfiled) {
            pPVar19 = IR::Instr::AsProfiledInstr(pIVar24);
            local_40._0_2_ = (pPVar19->u).field_3.fldInfoData.f1;
            bVar9 = ValueType::IsLikelyInt((ValueType *)local_40);
            if ((bVar9) &&
               (pRVar20 = IR::Opnd::AsRegOpnd(this_00), (pRVar20->m_sym->field_0x18 & 2) != 0)) {
              bVar9 = true;
            }
            else {
              pVVar22 = NewGenericValue(_newMin,(ValueType)local_40._0_2_,this_00);
              bVar9 = false;
            }
            if (!bVar9) {
              return pVVar22;
            }
          }
          goto LAB_004555cf;
        case ProfiledLdLen_A:
        case LdNaN:
        case LdInfinity:
        case LdTrue_ReuseLoc:
          break;
        case LdUndef:
          pVVar17 = &ValueType::Undefined;
          goto LAB_004547b0;
        case LdTrue:
        case LdFalse:
          goto switchD_004542a9_caseD_3b;
        default:
          if (OVar1 == LdThis) {
            this_02 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
            sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_02);
            this_03 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
            functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_03);
            bVar9 = Js::Phases::IsEnabled
                              ((Phases *)&DAT_015bbe90,OptTagChecksPhase,sourceContextId,functionId)
            ;
            if ((!bVar9) &&
               ((pGVar28 == (GlobOpt *)0x0 ||
                (bVar9 = ValueType::IsUninitialized
                                   ((ValueType *)&pGVar28->byteCodeConstantValueNumbersBv), bVar9)))
               ) {
              VVar12 = ValueType::GetObject(Object);
              local_4c = CONCAT22(local_4c._2_2_,VVar12.field_0);
              local_40._0_2_ = ValueType::ToLikely((ValueType *)&local_4c);
              aVar2.field_0 =
                   (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   ValueType::SetCanBeTaggedValue((ValueType *)local_40,false);
              goto LAB_004555fd;
            }
            goto LAB_004555cf;
          }
        }
        goto switchD_004542a9_caseD_28;
      }
      if ((pIVar24->field_0x38 & 0x10) == 0) {
        return pVVar23;
      }
      BVar13 = IR::Instr::GetBailOutKind(pIVar24);
      bailOutKind = BVar13 - BailOutOnArrayAccessHelperCall;
      if ((BVar13 >> 0x11 & 1) == 0) {
        bailOutKind = BVar13;
      }
      if ((bailOutKind != BailOutInvalid) && (bailOutKind != BailOutOnImplicitCallsPreOp)) {
        IR::Instr::SetBailOutKind(*pInstr,bailOutKind);
        return pVVar23;
      }
      IR::Instr::ClearBailOutInfo(*pInstr);
      return pVVar23;
    }
    if (OVar1 < InitLocalClosure) {
      switch(OVar1) {
      case Ld_I4:
      case LdAsmJsFunc:
        goto switchD_004542a9_caseD_45;
      case LdC_A_I4:
      case LdC_A_R8:
      case ArgIn_A:
switchD_004543aa_caseD_1e5:
        val = _max1;
        break;
      case LdMethodFromFlags:
      case LdSlotArr:
        goto switchD_004542a9_caseD_5e;
      case StSlot:
      case StSlotChkUndecl:
        goto switchD_004542a9_caseD_70;
      }
      goto switchD_004542a9_caseD_28;
    }
    if (BailOnTaggedValue < OVar1) {
      if (OVar1 != BytecodeArgOutCapture) {
        if (OVar1 == CheckFixedFld) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar15 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x12fd,"(false)",
                             "CheckFixedFld doesn\'t have a dst, so we should never get here");
          if (!bVar9) goto LAB_004556e6;
          *puVar15 = 0;
        }
        else {
          if (OVar1 != ExtendArg_A) goto switchD_004542a9_caseD_28;
          bVar9 = DoCSE(this);
          if (bVar9) {
            pBVar6 = this->currentBlock;
            pSVar18 = IR::Opnd::GetStackSym((*pInstr)->m_dst);
            pVVar23 = GlobOptBlockData::FindValue(&pBVar6->globOptData,&pSVar18->super_Sym);
            if (pVVar23 != (Value *)0x0) {
              return pVVar23;
            }
          }
        }
        goto LAB_004555cf;
      }
      goto switchD_004542a9_caseD_45;
    }
    switch(OVar1) {
    case InitLocalClosure:
      if (pIVar24->m_dst == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x14be,"(instr->GetDst())","instr->GetDst()");
        if (!bVar9) goto LAB_004556e6;
        *puVar15 = 0;
      }
      OVar10 = IR::Opnd::GetKind((*pInstr)->m_dst);
      if (OVar10 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x14bf,"(instr->GetDst()->IsRegOpnd())","instr->GetDst()->IsRegOpnd()");
        if (!bVar9) goto LAB_004556e6;
        *puVar15 = 0;
      }
      pRVar20 = IR::Opnd::AsRegOpnd((*pInstr)->m_dst);
      pSVar18 = pRVar20->m_sym;
      if (pSVar18 == (StackSym *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x14c2,"(opndStackSym != nullptr)","opndStackSym != nullptr");
        if (!bVar9) goto LAB_004556e6;
        *puVar15 = 0;
      }
      pOVar5 = pSVar18->m_objectInfo;
      if (pOVar5 == (ObjectSymInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x14c4,"(objectSymInfo != nullptr)","objectSymInfo != nullptr");
        if (!bVar9) goto LAB_004556e6;
        *puVar15 = 0;
      }
      pPVar27 = pOVar5->m_propertySymList;
      if (pPVar27 == (PropertySym *)0x0) goto LAB_004555cf;
      do {
        BVSparse<Memory::JitArenaAllocator>::Set(_newMin->slotSyms,(pPVar27->super_Sym).m_id);
        pPVar27 = pPVar27->m_nextInStackSymList;
        val = (Value *)0x0;
      } while (pPVar27 != (PropertySym *)0x0);
      break;
    case BrOnNotEmpty:
switchD_00454462_caseD_220:
      OVar10 = IR::Opnd::GetKind(this_00);
      this = _newMin;
      if (OVar10 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1497,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
        if (!bVar9) goto LAB_004556e6;
        *puVar15 = 0;
      }
      local_40._0_2_ = (this_00->m_valueType).field_0.bits;
      bVar9 = ValueType::IsString((ValueType *)local_40);
      if (!bVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1498,"(dst->GetValueType().IsString())",
                           "dst->GetValueType().IsString()");
        if (!bVar9) goto LAB_004556e6;
        *puVar15 = 0;
      }
      aVar2.bits = String;
      goto LAB_004555fd;
    case LdStr:
      val = _max1;
      if (_max1 == (Value *)0x0) {
        val = NewGenericValue(this,(ValueType)0x800,this_00);
      }
      break;
    case Coerce_Str:
switchD_00454462_caseD_228:
      local_40._0_2_ = ((*pInstr)->m_dst->m_valueType).field_0.bits;
      bVar9 = ValueType::IsString((ValueType *)local_40);
      if (!bVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x12a2,"(instr->GetDst()->GetValueType().IsString())",
                           "Creator of this instruction should have set the type");
        if (!bVar9) goto LAB_004556e6;
        *puVar15 = 0;
      }
      if (((((*pInstr)->m_src2 != (Opnd *)0x0) && (pGVar28 != (GlobOpt *)0x0)) &&
          (_newMin->prePassLoop == (Loop *)0x0)) &&
         (bVar9 = ValueType::IsString((ValueType *)&pGVar28->byteCodeConstantValueNumbersBv), bVar9)
         ) {
        IR::Instr::FreeSrc2(*pInstr);
      }
    case Coerce_StrOrRegex:
      val = (Value *)0x0;
      if ((pGVar28 != (GlobOpt *)0x0) && (_newMin->prePassLoop == (Loop *)0x0)) {
        bVar9 = ValueType::IsString((ValueType *)&pGVar28->byteCodeConstantValueNumbersBv);
        if (bVar9) {
          (*pInstr)->m_opcode = Ld_A;
switchD_004542a9_caseD_45:
          pGVar25 = _newMin;
          if ((_newMin->prePassLoop == (Loop *)0x0) &&
             (OVar10 = IR::Opnd::GetKind((*pInstr)->m_src1), OVar10 == OpndKindReg)) {
            pRVar20 = IR::Opnd::AsRegOpnd(this_00);
            if (((pRVar20->m_sym->field_0x18 & 1) != 0) &&
               ((pRVar20->m_sym->field_5).m_instrDef != (Instr *)0x0)) {
              pRVar20 = IR::Opnd::AsRegOpnd(this_00);
              pSVar18 = pRVar20->m_sym;
              pRVar20 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1);
              StackSym::CopySymAttrs(pSVar18,pRVar20->m_sym);
            }
          }
          if ((*pInstr)->m_kind == InstrKindProfiled) {
            pPVar19 = IR::Instr::AsProfiledInstr(*pInstr);
            local_40._0_2_ = (pPVar19->u).field_3.fldInfoData.f1;
            bVar9 = ValueType::IsLikelyInt((ValueType *)local_40);
            if ((bVar9) &&
               (((OVar10 = IR::Opnd::GetKind(this_00), OVar10 == OpndKindReg &&
                 (pRVar20 = IR::Opnd::AsRegOpnd(this_00), (pRVar20->m_sym->field_0x18 & 2) != 0)) ||
                ((OVar10 = IR::Opnd::GetKind((*pInstr)->m_src1), OVar10 == OpndKindReg &&
                 (pRVar20 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1),
                 (pRVar20->m_sym->field_0x18 & 2) != 0)))))) goto LAB_0045492a;
            if (pGVar28 != (GlobOpt *)0x0) {
              bVar9 = ValueType::IsUninitialized
                                ((ValueType *)&pGVar28->byteCodeConstantValueNumbersBv);
              if (bVar9) {
                if (pGVar25->prePassLoop != (Loop *)0x0) goto LAB_004551e2;
                *(undefined2 *)&pGVar28->byteCodeConstantValueNumbersBv = local_40._0_2_;
                IR::Opnd::SetValueType((*pInstr)->m_src1,(ValueType)local_40._0_2_);
              }
              goto LAB_0045492a;
            }
LAB_004551e2:
            val = NewGenericValue(pGVar25,(ValueType)local_40._0_2_,this_00);
          }
          else {
LAB_0045492a:
            val = (Value *)0x0;
          }
          if ((val == (Value *)0x0) && (val = _max1, _newMin->prePassLoop != (Loop *)0x0)) {
            pIVar24 = *pInstr;
            this = _newMin;
LAB_0045520e:
            val = ValueNumberTransferDstInPrepass(this,pIVar24,_max1);
          }
        }
        else {
LAB_004555cf:
          val = (Value *)0x0;
        }
      }
      break;
    case Conv_PrimStr:
      local_40._0_2_ = (pIVar24->m_dst->m_valueType).field_0.bits;
      bVar9 = ValueType::IsString((ValueType *)local_40);
      if (!bVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1296,"(instr->GetDst()->GetValueType().IsString())",
                           "Creator of this instruction should have set the type");
        if (!bVar9) goto LAB_004556e6;
        *puVar15 = 0;
      }
      val = (Value *)0x0;
      if ((pGVar28 != (GlobOpt *)0x0) && (_newMin->prePassLoop == (Loop *)0x0)) {
        bVar9 = ValueType::IsPrimitive((ValueType *)&pGVar28->byteCodeConstantValueNumbersBv);
        if (!bVar9) goto LAB_004555cf;
        (*pInstr)->m_opcode = Conv_Str;
        goto switchD_00454462_caseD_228;
      }
    }
    goto switchD_004542a9_caseD_28;
  }
  val = pVVar22;
  switch(OVar1) {
  case Incr_A:
  case Decr_A:
    ValueType::ValueType((ValueType *)local_40);
    pVVar23 = _max1;
    if (_max1 == (Value *)0x0) {
      local_40._0_2_ = (anon_union_2_4_ea848c7b_for_ValueType_13)0x208;
    }
    else {
      local_40._0_2_ = ValueType::ToDefiniteAnyNumber(&_max1->valueInfo->super_ValueType);
    }
    this = _newMin;
    aVar2.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetCanBeTaggedValue((ValueType *)local_40,true);
    pIVar24 = *pInstr;
    goto LAB_004554cc;
  case Neg_A:
  case ApplyArgs:
  case ProfiledDiv_A:
  case ProfiledRem_A:
  case Expo_A:
  case Conv_Obj:
  case Ld_A_ReuseLoc:
  case LdLocalObj:
  case LdInnerScope:
  case ChkUndecl:
  case EnsureNoRootFld:
  case EnsureNoRootRedeclFld:
  case ScopedEnsureNoRedeclFld:
  case InitUndecl:
  case InitUndeclLetFld:
  case InitUndeclRootLetFld:
  case InitUndeclRootConstFld:
  case InitConstSlot:
  case InitLetFld:
  case InitRootLetFld:
  case InitConstFld:
  case InitRootConstFld:
  case InitClassMember:
  case ArgIn0:
  case ArgOut_A:
  case ProfiledArgOut_A:
  case ArgOut_ANonVar:
  case ArgOut_Env:
  case Delete_A:
  case ProfiledLdFld:
  case LdFld_ReuseLoc:
  case ProfiledLdFld_ReuseLoc:
  case LdLocalFld:
  case ProfiledLdLocalFld:
  case LdLocalFld_ReuseLoc:
  case ProfiledLdLocalFld_ReuseLoc:
  case ProfiledLdFldForTypeOf:
  case ProfiledLdFldForCallApplyTarget:
  case ProfiledLdRootFld:
  case ProfiledLdMethodFld:
  case ProfiledLdRootMethodFld:
  case ProfiledStFld:
  case ProfiledStRootFld:
  case StLocalFld:
  case ProfiledStLocalFld:
  case ProfiledStFldStrict:
  case ProfiledStRootFldStrict:
  case ProfiledInitFld:
  case InitLocalFld:
  case ProfiledInitLocalFld:
  case InitRootFld:
  case ProfiledInitRootFld:
  case DeleteFld:
  case DeleteRootFld:
  case DeleteFldStrict:
  case DeleteRootFldStrict:
    break;
  case Not_A:
    if ((_max1 == (Value *)0x0) ||
       (bVar9 = ValueInfo::GetIntValMinMax
                          ((ValueInfo *)pGVar28,(int *)&local_4c,(int *)&local_50,
                           (bool)((byte)(*(uint *)&this->field_0xf4 >> 9) & 1)), !bVar9)) {
      local_4c = 0x80000000;
      local_50 = 0x7fffffff;
    }
    uVar14 = ~local_4c;
    local_64 = ~local_50;
    local_40._0_4_ = local_64;
    if ((int)uVar14 < (int)local_64) {
      local_40._0_4_ = uVar14;
    }
    if ((int)local_64 < (int)uVar14) {
      local_64 = uVar14;
    }
    pIVar24 = *pInstr;
    goto LAB_00454767;
  case Typeof:
  case TypeofElem:
    pVVar17 = &ValueType::String;
    goto LAB_004547b0;
  case Add_A:
    _min2 = pGVar25;
    ValueType::ValueType((ValueType *)local_40);
    if (pVVar23 == (Value *)0x0) {
LAB_00455372:
      if ((src2Val != (Value *)0x0) &&
         (bVar9 = ValueType::IsString((ValueType *)&_min2->byteCodeConstantValueNumbersBv), bVar9))
      {
LAB_00455388:
        local_40._0_2_ = (anon_union_2_4_ea848c7b_for_ValueType_13)0x800;
        goto LAB_004556cb;
      }
      if (_max1 != (Value *)0x0) {
        ppBVar29 = &pGVar28->byteCodeConstantValueNumbersBv;
        bVar9 = ValueType::IsNotString((ValueType *)ppBVar29);
        if ((bVar9) &&
           (bVar9 = ValueType::IsPrimitive((ValueType *)ppBVar29), bVar9 && src2Val != (Value *)0x0)
           ) {
          pVVar17 = (ValueType *)&_min2->byteCodeConstantValueNumbersBv;
          bVar9 = ValueType::IsNotString(pVVar17);
          if ((bVar9) && (bVar9 = ValueType::IsPrimitive(pVVar17), bVar9)) {
LAB_00455674:
            pVVar17 = &ValueType::Number;
            goto LAB_0045567b;
          }
        }
        bVar9 = ValueType::IsLikelyString((ValueType *)ppBVar29);
        if (!bVar9) goto LAB_004553f2;
LAB_00455410:
        pVVar17 = &ValueType::String;
LAB_004556c6:
        local_40._0_2_ = ValueType::ToLikely(pVVar17);
        goto LAB_004556cb;
      }
LAB_004553f2:
      if ((src2Val != (Value *)0x0) &&
         (bVar9 = ValueType::IsLikelyString((ValueType *)&_min2->byteCodeConstantValueNumbersBv),
         bVar9)) goto LAB_00455410;
      bVar9 = ValueType::IsUninitialized((ValueType *)local_40);
      this = _newMin;
      if (!bVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1403,"(valueType.IsUninitialized())","valueType.IsUninitialized()");
        if (!bVar9) {
LAB_004556e6:
          pcVar8 = (code *)invalidInstructionException();
          (*pcVar8)();
        }
        *puVar15 = 0;
      }
    }
    else {
      ppBVar29 = &pGVar28->byteCodeConstantValueNumbersBv;
      bVar9 = ValueType::IsLikelyNumber((ValueType *)ppBVar29);
      if (!bVar9 || src2Val == (Value *)0x0) {
LAB_00455366:
        bVar9 = ValueType::IsString((ValueType *)ppBVar29);
        if (!bVar9) goto LAB_00455372;
        goto LAB_00455388;
      }
      pVVar17 = (ValueType *)&_min2->byteCodeConstantValueNumbersBv;
      bVar9 = ValueType::IsLikelyNumber(pVVar17);
      if (!bVar9) goto LAB_00455366;
      bVar9 = ValueType::IsLikelyInt((ValueType *)ppBVar29);
      if (!bVar9) {
LAB_0045561a:
        bVar9 = ValueType::IsNumber((ValueType *)ppBVar29);
        if (bVar9) {
          bVar9 = ValueType::IsNumber(pVVar17);
          if (!bVar9) goto LAB_00455653;
          bVar9 = ValueType::IsFloat((ValueType *)ppBVar29);
          if (!bVar9) {
            bVar9 = ValueType::IsFloat(pVVar17);
            if (bVar9) goto LAB_0045564a;
            goto LAB_00455674;
          }
LAB_0045564a:
          pVVar17 = &ValueType::Float;
LAB_0045567b:
          local_40._0_2_ = ValueType::SetCanBeTaggedValue(pVVar17,true);
          goto LAB_004556cb;
        }
LAB_00455653:
        bVar9 = ValueType::IsLikelyFloat((ValueType *)ppBVar29);
        if ((bVar9) || (bVar9 = ValueType::IsLikelyFloat(pVVar17), bVar9)) {
          pVVar17 = &ValueType::Float;
        }
        else {
          pVVar17 = &ValueType::Number;
        }
        goto LAB_004556c6;
      }
      bVar9 = ValueType::IsLikelyInt(pVVar17);
      if (!bVar9) goto LAB_0045561a;
      bVar9 = ValueType::IsLikelyTaggedInt((ValueType *)ppBVar29);
      if (bVar9) {
        bVar9 = ValueType::IsLikelyTaggedInt(pVVar17);
      }
      else {
        bVar9 = false;
      }
      bVar30 = ValueType::IsNumber((ValueType *)ppBVar29);
      if ((!bVar30) || (bVar30 = ValueType::IsNumber(pVVar17), !bVar30)) {
        VVar12 = ValueType::GetInt(bVar9);
        pVVar17 = (ValueType *)&local_4c;
        local_4c = CONCAT22(local_4c._2_2_,VVar12.field_0);
        goto LAB_004556c6;
      }
      local_40._0_2_ = ValueType::GetNumberAndLikelyInt(bVar9);
LAB_004556cb:
      this = _newMin;
    }
    pIVar24 = *pInstr;
    pVVar23 = _max1;
    aVar2 = (anon_union_2_4_ea848c7b_for_ValueType_13)local_40._0_2_;
    goto LAB_004554cc;
  case Div_A:
    _min2 = pGVar25;
    VVar12 = GetDivValueType(this,pIVar24,_max1,src2Val,false);
    local_40._0_2_ = VVar12.field_0;
    bVar9 = ValueType::IsLikelyInt((ValueType *)local_40);
    if ((bVar9) || (bVar9 = ValueType::IsFloat((ValueType *)local_40), bVar9)) {
      VVar12 = ValueType::SetCanBeTaggedValue((ValueType *)local_40,true);
      pVVar22 = CreateDstUntransferredValue(this,VVar12,*pInstr,_max1,src2Val);
      bVar9 = false;
    }
    else {
      bVar9 = true;
    }
    pGVar25 = _min2;
    if (!bVar9) {
      return pVVar22;
    }
  case Mul_A:
  case Rem_A:
  case Sub_A:
    pVVar23 = _max1;
    ValueType::ValueType((ValueType *)local_40);
    if (pVVar23 == (Value *)0x0) {
LAB_0045548a:
      if ((src2Val == (Value *)0x0) ||
         (bVar9 = ValueType::IsLikelyFloat((ValueType *)&pGVar25->byteCodeConstantValueNumbersBv),
         !bVar9)) {
        pVVar17 = &ValueType::Number;
      }
      else {
LAB_0045549f:
        pVVar17 = &ValueType::Float;
      }
      aVar2.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetCanBeTaggedValue(pVVar17,true);
    }
    else {
      ppBVar29 = &pGVar28->byteCodeConstantValueNumbersBv;
      bVar9 = ValueType::IsLikelyInt((ValueType *)ppBVar29);
      if (!bVar9 || src2Val == (Value *)0x0) {
LAB_0045547e:
        bVar9 = ValueType::IsLikelyFloat((ValueType *)ppBVar29);
        if (!bVar9) goto LAB_0045548a;
        goto LAB_0045549f;
      }
      pVVar17 = (ValueType *)&pGVar25->byteCodeConstantValueNumbersBv;
      bVar9 = ValueType::IsLikelyInt(pVVar17);
      if ((!bVar9) || ((*pInstr)->m_opcode == Div_A)) goto LAB_0045547e;
      bVar9 = ValueType::IsLikelyTaggedInt((ValueType *)ppBVar29);
      if (bVar9) {
        bVar30 = ValueType::IsLikelyTaggedInt(pVVar17);
        bVar9 = true;
        if (!bVar30) {
          bVar9 = (*pInstr)->m_opcode == Rem_A;
        }
      }
      else {
        bVar9 = false;
      }
      bVar30 = ValueType::IsNumber((ValueType *)ppBVar29);
      if ((bVar30) && (bVar30 = ValueType::IsNumber(pVVar17), bVar30)) {
        aVar2.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::GetNumberAndLikelyInt(bVar9);
      }
      else {
        VVar12 = ValueType::GetInt(bVar9);
        local_4c = CONCAT22(local_4c._2_2_,VVar12.field_0);
        aVar2.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::ToLikely((ValueType *)&local_4c);
      }
    }
    local_40._0_2_ = aVar2.bits;
    pIVar24 = *pInstr;
    pVVar23 = _max1;
    this = _newMin;
LAB_004554cc:
    pVVar23 = CreateDstUntransferredValue(this,(ValueType)aVar2.field_0,pIVar24,pVVar23,src2Val);
    return pVVar23;
  case And_A:
  case Or_A:
  case Xor_A:
  case Shl_A:
  case Shr_A:
  case ShrU_A:
    if ((_max1 == (Value *)0x0) ||
       (bVar9 = ValueInfo::GetIntValMinMax
                          ((ValueInfo *)pGVar28,(int *)&local_4c,(int *)&local_50,
                           (bool)((byte)(*(uint *)&this->field_0xf4 >> 9) & 1)), !bVar9)) {
      local_4c = 0x80000000;
      local_50 = 0x7fffffff;
    }
    if ((src2Val == (Value *)0x0) ||
       (bVar9 = ValueInfo::GetIntValMinMax
                          ((ValueInfo *)pGVar25,&local_60,&newMax,
                           (bool)((byte)(*(uint *)&this->field_0xf4 >> 9) & 1)), pGVar28 = pGVar25,
       !bVar9)) {
      local_60 = -0x80000000;
      newMax = 0x7fffffff;
    }
    if (((*pInstr)->m_opcode == ShrU_A) && ((int)local_4c < 0)) {
      pGVar28 = (GlobOpt *)local_40;
      IntConstantBounds::IntConstantBounds((IntConstantBounds *)pGVar28,local_60,newMax);
      IVar16 = IntConstantBounds::And_0x1f((IntConstantBounds *)pGVar28);
      if (-1 < (long)IVar16 && IVar16.lowerBound < 1) {
        aVar2.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::SetCanBeTaggedValue(&ValueType::AnyNumber,true);
        pIVar24 = *pInstr;
        pVVar23 = _max1;
        goto LAB_004554cc;
      }
    }
    PropagateIntRangeBinary
              (pGVar28,*pInstr,local_4c,local_50,local_60,newMax,(int32 *)local_40,
               (int32 *)&local_64);
    pIVar24 = *pInstr;
LAB_00454767:
    pVVar23 = CreateDstUntransferredIntValue(this,local_40._0_4_,local_64,pIVar24,_max1,src2Val);
    return pVVar23;
  case CmEq_A:
  case CmGe_A:
  case CmGt_A:
  case CmLt_A:
  case CmLe_A:
  case CmNeq_A:
  case CmSrEq_A:
  case CmSrNeq_A:
    goto switchD_004542a9_caseD_3b;
  case Conv_Num:
    bVar9 = ValueType::IsNumber((ValueType *)&pGVar28->byteCodeConstantValueNumbersBv);
    if (bVar9) {
      val = _max1;
      if (_newMin->prePassLoop != (Loop *)0x0) {
        pIVar24 = *pInstr;
        this = _newMin;
        goto LAB_0045520e;
      }
      break;
    }
    VVar12 = ValueType::ToDefiniteAnyNumber((ValueType *)&pGVar28->byteCodeConstantValueNumbersBv);
    local_40._0_2_ = VVar12.field_0;
    aVar2.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetCanBeTaggedValue((ValueType *)local_40,true);
    this = _newMin;
    goto LAB_004555fd;
  case Ld_A:
    goto switchD_004542a9_caseD_45;
  case LdC_A_Null:
    pVVar17 = &ValueType::Null;
LAB_004547b0:
    aVar2 = (anon_union_2_4_ea848c7b_for_ValueType_13)pVVar17->field_0;
    goto LAB_004555fd;
  case LdFld:
  case LdFldForTypeOf:
  case LdFldForCallApplyTarget:
  case LdRootFld:
  case LdMethodFld:
  case LdRootMethodFld:
  case ScopedLdFld:
  case ScopedLdMethodFld:
switchD_004542a9_caseD_5e:
    if (pIVar24->m_kind == InstrKindProfiled) {
      local_40._0_2_ = *(undefined2 *)&pIVar24[1]._vptr_Instr;
      bVar9 = ValueType::IsLikelyInt((ValueType *)local_40);
      if (((!bVar9) || (OVar10 = IR::Opnd::GetKind(this_00), OVar10 != OpndKindReg)) ||
         (pRVar20 = IR::Opnd::AsRegOpnd(this_00), (pRVar20->m_sym->field_0x18 & 2) == 0)) {
        if (pGVar28 == (GlobOpt *)0x0) {
          pGVar25 = _newMin;
LAB_0045522a:
          val = NewGenericValue(pGVar25,(ValueType)local_40._0_2_,this_00);
          goto LAB_00455239;
        }
        bVar9 = ValueType::IsUninitialized((ValueType *)&pGVar28->byteCodeConstantValueNumbersBv);
        pGVar25 = _newMin;
        if (bVar9) {
          if (_newMin->prePassLoop != (Loop *)0x0) {
            OVar10 = IR::Opnd::GetKind(this_00);
            if (OVar10 == OpndKindReg) {
              pRVar20 = IR::Opnd::AsRegOpnd(this_00);
              if (((pRVar20->m_sym->field_0x18 & 1) != 0) &&
                 ((pRVar20->m_sym->field_5).m_instrDef != (Instr *)0x0)) goto LAB_00454abd;
            }
            goto LAB_0045522a;
          }
LAB_00454abd:
          *(undefined2 *)&pGVar28->byteCodeConstantValueNumbersBv = local_40._0_2_;
          IR::Opnd::SetValueType((*pInstr)->m_src1,(ValueType)local_40._0_2_);
        }
      }
      val = (Value *)0x0;
    }
    else {
      val = (Value *)0x0;
    }
LAB_00455239:
    pGVar28 = _newMin;
    if ((val == (Value *)0x0) && (val = _max1, _newMin->prePassLoop != (Loop *)0x0)) {
      val = ValueNumberTransferDstInPrepass(_newMin,*pInstr,_max1);
    }
    if (pGVar28->prePassLoop == (Loop *)0x0) {
      if (val != (Value *)0x0) {
        valueInfo = val->valueInfo;
        pSVar7 = valueInfo->symStore;
        if ((pSVar7 == (Sym *)0x0) || (pSVar7->m_kind != SymKindStack)) {
          OVar10 = IR::Opnd::GetKind(this_00);
          if (OVar10 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar15 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x1336,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
            if (!bVar9) goto LAB_004556e6;
            *puVar15 = 0;
          }
          pRVar20 = IR::Opnd::AsRegOpnd(this_00);
          SetSymStoreDirect(_newMin,valueInfo,&pRVar20->m_sym->super_Sym);
        }
      }
      if (val != _max1) {
        GlobOptBlockData::SetValue(&_newMin->currentBlock->globOptData,val,(*pInstr)->m_src1);
      }
    }
    break;
  case StFld:
  case StRootFld:
  case StFldStrict:
  case StRootFldStrict:
  case InitFld:
switchD_004542a9_caseD_70:
    bVar30 = _max1 == (Value *)0x0;
    bVar9 = DoFieldCopyProp(this);
    if (!bVar9 || bVar30) {
      return (Value *)0x0;
    }
    if (src2Val != (Value *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1361,"(!src2Val)","Bad src Values...");
      if (!bVar9) goto LAB_004556e6;
      *puVar15 = 0;
    }
    if (*(char *)((long)pp_Var26 + 0x14) != '\x02') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1363,"(sym->IsPropertySym())","sym->IsPropertySym()");
      if (!bVar9) goto LAB_004556e6;
      *puVar15 = 0;
    }
    this = _newMin;
    i = *(BVIndex *)(pp_Var26 + 2);
    uVar3 = (*pInstr)->m_opcode;
    if ((1 < (ushort)(uVar3 - 0x1f7)) &&
       (BVar11 = BVSparse<Memory::JitArenaAllocator>::Test
                           ((_newMin->currentBlock->globOptData).liveFields,i), BVar11 != '\0')) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1365,
                         "(instr->m_opcode == Js::OpCode::StSlot || instr->m_opcode == Js::OpCode::StSlotChkUndecl || !CurrentBlockData()->liveFields->Test(symId))"
                         ,
                         "instr->m_opcode == Js::OpCode::StSlot || instr->m_opcode == Js::OpCode::StSlotChkUndecl || !CurrentBlockData()->liveFields->Test(symId)"
                        );
      if (!bVar9) goto LAB_004556e6;
      *puVar15 = 0;
    }
    BVSparse<Memory::JitArenaAllocator>::Set((this->currentBlock->globOptData).liveFields,i);
    if ((this->prePassLoop == (Loop *)0x0) && ((this_00->field_0xb & 4) != 0)) {
      symOpnd = IR::Opnd::AsSymOpnd(this_00);
      EndFieldLifetime(this,symOpnd);
    }
    val = _max1;
    if (this->prePassLoop == (Loop *)0x0) break;
    pIVar24 = *pInstr;
    goto LAB_0045520e;
  default:
    if (OVar1 == CallI) {
      OVar10 = IR::Opnd::GetKind(this_00);
      this = _newMin;
      if (OVar10 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1439,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
        if (!bVar9) goto LAB_004556e6;
        *puVar15 = 0;
      }
      pRVar20 = IR::Opnd::AsRegOpnd(this_00);
      aVar2 = (pRVar20->super_Opnd).m_valueType.field_0;
      goto LAB_004555fd;
    }
    if (OVar1 == LdSlot) goto switchD_004542a9_caseD_5e;
  }
switchD_004542a9_caseD_28:
  if (val == (Value *)0x0) {
    uVar4 = this_00->m_valueType;
    this = _newMin;
    aVar2 = (anon_union_2_4_ea848c7b_for_ValueType_13)uVar4;
LAB_004555fd:
    pVVar23 = NewGenericValue(this,(ValueType)aVar2.field_0,this_00);
  }
  else {
    pVVar23 = GlobOptBlockData::SetValue(&_newMin->currentBlock->globOptData,val,this_00);
  }
  return pVVar23;
}

Assistant:

Value *
GlobOpt::ValueNumberDst(IR::Instr **pInstr, Value *src1Val, Value *src2Val)
{
    IR::Instr *&instr = *pInstr;
    IR::Opnd *dst = instr->GetDst();
    Value *dstVal = nullptr;
    Sym *sym;

    if (instr->CallsSetter())
    {
        return nullptr;
    }
    if (dst == nullptr)
    {
        return nullptr;
    }

    switch (dst->GetKind())
    {
    case IR::OpndKindSym:
        sym = dst->AsSymOpnd()->m_sym;
        break;

    case IR::OpndKindReg:
        sym = dst->AsRegOpnd()->m_sym;

        if (OpCodeAttr::TempNumberProducing(instr->m_opcode))
        {
            CurrentBlockData()->isTempSrc->Set(sym->m_id);
        }
        else if (OpCodeAttr::TempNumberTransfer(instr->m_opcode))
        {
            IR::Opnd *src1 = instr->GetSrc1();

            if (src1->IsRegOpnd() && CurrentBlockData()->isTempSrc->Test(src1->AsRegOpnd()->m_sym->m_id))
            {
                StackSym *src1Sym = src1->AsRegOpnd()->m_sym;
                // isTempSrc is used for marking isTempLastUse, which is used to generate AddLeftDead()
                // calls instead of the normal Add helpers. It tells the runtime that concats can use string
                // builders.
                // We need to be careful in the case where src1 points to a string builder and is getting aliased.
                // Clear the bit on src and dst of the transfer instr in this case, unless we can prove src1
                // isn't pointing at a string builder, like if it is single def and the def instr is not an Add,
                // but TempProducing.
                if (src1Sym->IsSingleDef() && src1Sym->m_instrDef->m_opcode != Js::OpCode::Add_A
                    && OpCodeAttr::TempNumberProducing(src1Sym->m_instrDef->m_opcode))
                {
                    CurrentBlockData()->isTempSrc->Set(sym->m_id);
                }
                else
                {
                    CurrentBlockData()->isTempSrc->Clear(src1->AsRegOpnd()->m_sym->m_id);
                    CurrentBlockData()->isTempSrc->Clear(sym->m_id);
                }
            }
            else
            {
                CurrentBlockData()->isTempSrc->Clear(sym->m_id);
            }
        }
        else
        {
            CurrentBlockData()->isTempSrc->Clear(sym->m_id);
        }
        break;

    case IR::OpndKindIndir:
        return nullptr;

    default:
        return nullptr;
    }

    int32 min1, max1, min2, max2, newMin, newMax;
    ValueInfo *src1ValueInfo = (src1Val ? src1Val->GetValueInfo() : nullptr);
    ValueInfo *src2ValueInfo = (src2Val ? src2Val->GetValueInfo() : nullptr);

    switch (instr->m_opcode)
    {
    case Js::OpCode::Conv_PrimStr:
        AssertMsg(instr->GetDst()->GetValueType().IsString(),
            "Creator of this instruction should have set the type");
        if (this->IsLoopPrePass() || src1ValueInfo == nullptr || !src1ValueInfo->IsPrimitive())
        {
            break;
        }
        instr->m_opcode = Js::OpCode::Conv_Str;
        // fall-through
    case Js::OpCode::Conv_Str:
    // This opcode is commented out since we don't track regex information in GlobOpt now.
    //case Js::OpCode::Coerce_Regex:
    case Js::OpCode::Coerce_Str:
        AssertMsg(instr->GetDst()->GetValueType().IsString(),
            "Creator of this instruction should have set the type");

        // Due to fall through and the fact that Ld_A only takes one source,
        // free the other source here.
        if (instr->GetSrc2() && !(this->IsLoopPrePass() || src1ValueInfo == nullptr || !src1ValueInfo->IsString()))
        {
            instr->FreeSrc2();
        }

        // fall-through
    case Js::OpCode::Coerce_StrOrRegex:
        // We don't set the ValueType of src1 for Coerce_StrOrRegex, hence skip the ASSERT
        if (this->IsLoopPrePass() || src1ValueInfo == nullptr || !src1ValueInfo->IsString())
        {
            break;
        }
        instr->m_opcode = Js::OpCode::Ld_A;
        // fall-through

    case Js::OpCode::BytecodeArgOutCapture:
    case Js::OpCode::LdAsmJsFunc:
    case Js::OpCode::Ld_A:
    case Js::OpCode::Ld_I4:

        // Propagate sym attributes across the reg copy.
        if (!this->IsLoopPrePass() && instr->GetSrc1()->IsRegOpnd())
        {
            if (dst->AsRegOpnd()->m_sym->IsSingleDef())
            {
                dst->AsRegOpnd()->m_sym->CopySymAttrs(instr->GetSrc1()->AsRegOpnd()->m_sym);
            }
        }

        if (instr->IsProfiledInstr())
        {
            const ValueType profiledValueType(instr->AsProfiledInstr()->u.FldInfo().valueType);
            if(!(
                    profiledValueType.IsLikelyInt() &&
                    (
                        (dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->m_isNotNumber) ||
                        (instr->GetSrc1()->IsRegOpnd() && instr->GetSrc1()->AsRegOpnd()->m_sym->m_isNotNumber)
                    )
                ))
            {
                if(!src1ValueInfo)
                {
                    dstVal = this->NewGenericValue(profiledValueType, dst);
                }
                else if(src1ValueInfo->IsUninitialized())
                {
                    if(IsLoopPrePass())
                    {
                        dstVal = this->NewGenericValue(profiledValueType, dst);
                    }
                    else
                    {
                        // Assuming the profile data gives more precise value types based on the path it took at runtime, we
                        // can improve the original value type.
                        src1ValueInfo->Type() = profiledValueType;
                        instr->GetSrc1()->SetValueType(profiledValueType);
                    }
                }
            }
        }

        if (dstVal == nullptr)
        {
            // Ld_A is just transferring the value
            dstVal = this->ValueNumberTransferDst(instr, src1Val);
        }

        break;

    case Js::OpCode::ExtendArg_A:
    {
        // SIMD_JS
        // We avoid transforming EAs to Lds to keep the IR shape consistent and avoid CSEing of EAs.
        // CSEOptimize only assigns a Value to the EA dst, and doesn't turn it to a Ld. If this happened, we shouldn't assign a new Value here.
        if (DoCSE())
        {
            IR::Opnd * currDst = instr->GetDst();
            Value * currDstVal = CurrentBlockData()->FindValue(currDst->GetStackSym());
            if (currDstVal != nullptr)
            {
                return currDstVal;
            }
        }
        break;
    }

    case Js::OpCode::CheckFixedFld:
        AssertMsg(false, "CheckFixedFld doesn't have a dst, so we should never get here");
        break;

    case Js::OpCode::LdSlot:
    case Js::OpCode::LdSlotArr:
    case Js::OpCode::LdFld:
    case Js::OpCode::LdFldForTypeOf:
    case Js::OpCode::LdFldForCallApplyTarget:
    // Do not transfer value type on LdRootFldForTypeOf to prevent copy-prop to LdRootFld in case the field doesn't exist since LdRootFldForTypeOf does not throw.
    // Same goes for ScopedLdFldForTypeOf as we'll end up loading the property from the root object if the property is not in the scope chain.
    //case Js::OpCode::LdRootFldForTypeOf:
    //case Js::OpCode::ScopedLdFldForTypeOf:
    case Js::OpCode::LdRootFld:
    case Js::OpCode::LdMethodFld:
    case Js::OpCode::LdRootMethodFld:
    case Js::OpCode::ScopedLdMethodFld:
    case Js::OpCode::LdMethodFromFlags:
    case Js::OpCode::ScopedLdFld:
        if (instr->IsProfiledInstr())
        {
            ValueType profiledValueType(instr->AsProfiledInstr()->u.FldInfo().valueType);
            if(!(profiledValueType.IsLikelyInt() && dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->m_isNotNumber))
            {
                if(!src1ValueInfo)
                {
                    dstVal = this->NewGenericValue(profiledValueType, dst);
                }
                else if(src1ValueInfo->IsUninitialized())
                {
                    if(IsLoopPrePass() && (!dst->IsRegOpnd() || !dst->AsRegOpnd()->m_sym->IsSingleDef()))
                    {
                        dstVal = this->NewGenericValue(profiledValueType, dst);
                    }
                    else
                    {
                        // Assuming the profile data gives more precise value types based on the path it took at runtime, we
                        // can improve the original value type.
                        src1ValueInfo->Type() = profiledValueType;
                        instr->GetSrc1()->SetValueType(profiledValueType);
                    }
                }
            }
        }
        if (dstVal == nullptr)
        {
            dstVal = this->ValueNumberTransferDst(instr, src1Val);
        }

        if(!this->IsLoopPrePass())
        {
            // We cannot transfer value if the field hasn't been copy prop'd because we don't generate
            // an implicit call bailout between those values if we don't have "live fields" unless, we are hoisting the field.
            ValueInfo *dstValueInfo = (dstVal ? dstVal->GetValueInfo() : nullptr);

            // Update symStore if it isn't a stackSym
            if (dstVal && (!dstValueInfo->GetSymStore() || !dstValueInfo->GetSymStore()->IsStackSym()))
            {
                Assert(dst->IsRegOpnd());
                this->SetSymStoreDirect(dstValueInfo, dst->AsRegOpnd()->m_sym);
            }
            if (src1Val != dstVal)
            {
                CurrentBlockData()->SetValue(dstVal, instr->GetSrc1());
            }
        }
        break;

    case Js::OpCode::LdC_A_R8:
    case Js::OpCode::LdC_A_I4:
    case Js::OpCode::ArgIn_A:
        dstVal = src1Val;
        break;

    case Js::OpCode::LdStr:
        if (src1Val == nullptr)
        {
            src1Val = NewGenericValue(ValueType::String, dst);
        }
        dstVal = src1Val;
        break;

    // LdElemUndef only assign undef if the field doesn't exist.
    // So we don't actually know what the value is, so we can't really copy prop it.
    //case Js::OpCode::LdElemUndef:
    case Js::OpCode::StSlot:
    case Js::OpCode::StSlotChkUndecl:
    case Js::OpCode::StFld:
    case Js::OpCode::StRootFld:
    case Js::OpCode::StFldStrict:
    case Js::OpCode::StRootFldStrict:
    case Js::OpCode::InitFld:
    case Js::OpCode::InitComputedProperty:
        if (DoFieldCopyProp())
        {
            if (src1Val == nullptr)
            {
                // src1 may have no value if it's not a valid var, e.g., NULL for let/const initialization.
                // Consider creating generic values for such things.
                return nullptr;
            }
            AssertMsg(!src2Val, "Bad src Values...");

            Assert(sym->IsPropertySym());
            SymID symId = sym->m_id;
            Assert(instr->m_opcode == Js::OpCode::StSlot || instr->m_opcode == Js::OpCode::StSlotChkUndecl || !CurrentBlockData()->liveFields->Test(symId));

            CurrentBlockData()->liveFields->Set(symId);
            if (!this->IsLoopPrePass() && dst->GetIsDead())
            {
                // Take the property sym out of the live fields set (with special handling for loops).
                this->EndFieldLifetime(dst->AsSymOpnd());
            }

            dstVal = this->ValueNumberTransferDst(instr, src1Val);
        }
        else
        {
            return nullptr;
        }
        break;

    case Js::OpCode::Conv_Num:
        if(src1ValueInfo->IsNumber())
        {
            dstVal = ValueNumberTransferDst(instr, src1Val);
        }
        else
        {
            return NewGenericValue(src1ValueInfo->Type().ToDefiniteAnyNumber().SetCanBeTaggedValue(true), dst);
        }
        break;

    case Js::OpCode::Not_A:
    {
        if (!src1Val || !src1ValueInfo->GetIntValMinMax(&min1, &max1, this->DoAggressiveIntTypeSpec()))
        {
            min1 = INT32_MIN;
            max1 = INT32_MAX;
        }

        this->PropagateIntRangeForNot(min1, max1, &newMin, &newMax);
        return CreateDstUntransferredIntValue(newMin, newMax, instr, src1Val, src2Val);
    }

    case Js::OpCode::Xor_A:
    case Js::OpCode::Or_A:
    case Js::OpCode::And_A:
    case Js::OpCode::Shl_A:
    case Js::OpCode::Shr_A:
    case Js::OpCode::ShrU_A:
    {
        if (!src1Val || !src1ValueInfo->GetIntValMinMax(&min1, &max1, this->DoAggressiveIntTypeSpec()))
        {
            min1 = INT32_MIN;
            max1 = INT32_MAX;
        }
        if (!src2Val || !src2ValueInfo->GetIntValMinMax(&min2, &max2, this->DoAggressiveIntTypeSpec()))
        {
            min2 = INT32_MIN;
            max2 = INT32_MAX;
        }

        if (instr->m_opcode == Js::OpCode::ShrU_A &&
            min1 < 0 &&
            IntConstantBounds(min2, max2).And_0x1f().Contains(0))
        {
            // Src1 may be too large to represent as a signed int32, and src2 may be zero.
            // Since the result can therefore be too large to represent as a signed int32,
            // include Number in the value type.
            return CreateDstUntransferredValue(
                ValueType::AnyNumber.SetCanBeTaggedValue(true), instr, src1Val, src2Val);
        }

        this->PropagateIntRangeBinary(instr, min1, max1, min2, max2, &newMin, &newMax);
        return CreateDstUntransferredIntValue(newMin, newMax, instr, src1Val, src2Val);
    }

    case Js::OpCode::Incr_A:
    case Js::OpCode::Decr_A:
    {
        ValueType valueType;
        if(src1Val)
        {
            valueType = src1Val->GetValueInfo()->Type().ToDefiniteAnyNumber();
        }
        else
        {
            valueType = ValueType::Number;
        }
        return CreateDstUntransferredValue(valueType.SetCanBeTaggedValue(true), instr, src1Val, src2Val);
    }

    case Js::OpCode::Add_A:
    {
        ValueType valueType;
        if (src1Val && src1ValueInfo->IsLikelyNumber() && src2Val && src2ValueInfo->IsLikelyNumber())
        {
            if(src1ValueInfo->IsLikelyInt() && src2ValueInfo->IsLikelyInt())
            {
                // When doing aggressiveIntType, just assume the result is likely going to be int
                // if both input is int.
                const bool isLikelyTagged = src1ValueInfo->IsLikelyTaggedInt() && src2ValueInfo->IsLikelyTaggedInt();
                if(src1ValueInfo->IsNumber() && src2ValueInfo->IsNumber())
                {
                    // If both of them are numbers then we can definitely say that the result is a number.
                    valueType = ValueType::GetNumberAndLikelyInt(isLikelyTagged);
                }
                else
                {
                    // This is only likely going to be int but can be a string as well.
                    valueType = ValueType::GetInt(isLikelyTagged).ToLikely();
                }
            }
            else
            {
                // We can only be certain of any thing if both of them are numbers.
                // Otherwise, the result could be string.
                if (src1ValueInfo->IsNumber() && src2ValueInfo->IsNumber())
                {
                    if (src1ValueInfo->IsFloat() || src2ValueInfo->IsFloat())
                    {
                        // If one of them is a float, the result probably is a float instead of just int
                        // but should always be a number.
                        valueType = ValueType::Float.SetCanBeTaggedValue(true);
                    }
                    else
                    {
                        // Could be int, could be number
                        valueType = ValueType::Number.SetCanBeTaggedValue(true);
                    }
                }
                else if (src1ValueInfo->IsLikelyFloat() || src2ValueInfo->IsLikelyFloat())
                {
                    // Result is likely a float (but can be anything)
                    valueType = ValueType::Float.ToLikely();
                }
                else
                {
                    // Otherwise it is a likely int or float (but can be anything)
                    valueType = ValueType::Number.ToLikely();
                }
            }
        }
        else if((src1Val && src1ValueInfo->IsString()) || (src2Val && src2ValueInfo->IsString()))
        {
            // String + anything should always result in a string
            valueType = ValueType::String;
        }
        else if((src1Val && src1ValueInfo->IsNotString() && src1ValueInfo->IsPrimitive())
            && (src2Val && src2ValueInfo->IsNotString() && src2ValueInfo->IsPrimitive()))
        {
            // If src1 and src2 are not strings and primitive, add should yield a number.
            valueType = ValueType::Number.SetCanBeTaggedValue(true);
        }
        else if((src1Val && src1ValueInfo->IsLikelyString()) || (src2Val && src2ValueInfo->IsLikelyString()))
        {
            // likelystring + anything should always result in a likelystring
            valueType = ValueType::String.ToLikely();
        }
        else
        {
            // Number or string. Could make the value a merge of Number and String, but Uninitialized is more useful at the moment.
            Assert(valueType.IsUninitialized());
        }

        return CreateDstUntransferredValue(valueType, instr, src1Val, src2Val);
    }

    case Js::OpCode::Div_A:
        {
            ValueType divValueType = GetDivValueType(instr, src1Val, src2Val, false);
            if (divValueType.IsLikelyInt() || divValueType.IsFloat())
            {
                return CreateDstUntransferredValue(divValueType.SetCanBeTaggedValue(true), instr, src1Val, src2Val);
            }
        }
        // fall-through

    case Js::OpCode::Sub_A:
    case Js::OpCode::Mul_A:
    case Js::OpCode::Rem_A:
    {
        ValueType valueType;
        if( src1Val &&
            src1ValueInfo->IsLikelyInt() &&
            src2Val &&
            src2ValueInfo->IsLikelyInt() &&
            instr->m_opcode != Js::OpCode::Div_A)
        {
            const bool isLikelyTagged =
                src1ValueInfo->IsLikelyTaggedInt() && (src2ValueInfo->IsLikelyTaggedInt() || instr->m_opcode == Js::OpCode::Rem_A);
            if(src1ValueInfo->IsNumber() && src2ValueInfo->IsNumber())
            {
                valueType = ValueType::GetNumberAndLikelyInt(isLikelyTagged);
            }
            else
            {
                valueType = ValueType::GetInt(isLikelyTagged).ToLikely();
            }
        }
        else if ((src1Val && src1ValueInfo->IsLikelyFloat()) || (src2Val && src2ValueInfo->IsLikelyFloat()))
        {
            // This should ideally be NewNumberAndLikelyFloatValue since we know the result is a number but not sure if it will
            // be a float value. However, that Number/LikelyFloat value type doesn't exist currently and all the necessary
            // checks are done for float values (tagged int checks, etc.) so it's sufficient to just create a float value here.
            valueType = ValueType::Float.SetCanBeTaggedValue(true);
        }
        else
        {
            valueType = ValueType::Number.SetCanBeTaggedValue(true);
        }

        return CreateDstUntransferredValue(valueType, instr, src1Val, src2Val);
    }

    case Js::OpCode::CallI:
        Assert(dst->IsRegOpnd());
        return NewGenericValue(dst->AsRegOpnd()->GetValueType(), dst);

    case Js::OpCode::LdElemI_A:
    {
        dstVal = ValueNumberLdElemDst(pInstr, src1Val);
        const ValueType baseValueType(instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetValueType());
        if( (
                baseValueType.IsLikelyNativeArray() ||
            #ifdef _M_IX86
                (
                    !AutoSystemInfo::Data.SSE2Available() &&
                    baseValueType.IsLikelyObject() &&
                    (
                        baseValueType.GetObjectType() == ObjectType::Float32Array ||
                        baseValueType.GetObjectType() == ObjectType::Float64Array
                    )
                )
            #else
                false
            #endif
            ) &&
            instr->GetDst()->IsVar() &&
            instr->HasBailOutInfo())
        {
            // The lowerer is not going to generate a fast path for this case. Remove any bailouts that require the fast
            // path. Note that the removed bailouts should not be necessary for correctness.
            IR::BailOutKind bailOutKind = instr->GetBailOutKind();
            if(bailOutKind & IR::BailOutOnArrayAccessHelperCall)
            {
                bailOutKind -= IR::BailOutOnArrayAccessHelperCall;
            }
            if(bailOutKind == IR::BailOutOnImplicitCallsPreOp)
            {
                bailOutKind -= IR::BailOutOnImplicitCallsPreOp;
            }
            if(bailOutKind)
            {
                instr->SetBailOutKind(bailOutKind);
            }
            else
            {
                instr->ClearBailOutInfo();
            }
        }
        return dstVal;
    }

    case Js::OpCode::LdMethodElem:
        // Not worth profiling this, just assume it's likely object (should be likely function but ValueType does not track
        // functions currently, so using ObjectType::Object instead)
        dstVal = NewGenericValue(ValueType::GetObject(ObjectType::Object).ToLikely(), dst);
        if(instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsLikelyNativeArray() && instr->HasBailOutInfo())
        {
            // The lowerer is not going to generate a fast path for this case. Remove any bailouts that require the fast
            // path. Note that the removed bailouts should not be necessary for correctness.
            IR::BailOutKind bailOutKind = instr->GetBailOutKind();
            if(bailOutKind & IR::BailOutOnArrayAccessHelperCall)
            {
                bailOutKind -= IR::BailOutOnArrayAccessHelperCall;
            }
            if(bailOutKind == IR::BailOutOnImplicitCallsPreOp)
            {
                bailOutKind -= IR::BailOutOnImplicitCallsPreOp;
            }
            if(bailOutKind)
            {
                instr->SetBailOutKind(bailOutKind);
            }
            else
            {
                instr->ClearBailOutInfo();
            }
        }
        return dstVal;

    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
        dstVal = this->ValueNumberTransferDst(instr, src1Val);
        break;

    case Js::OpCode::LdLen_A:
        if (instr->IsProfiledInstr())
        {
            const ValueType profiledValueType(instr->AsProfiledInstr()->u.FldInfo().valueType);
            if(!(profiledValueType.IsLikelyInt() && dst->AsRegOpnd()->m_sym->m_isNotNumber))
            {
                return this->NewGenericValue(profiledValueType, dst);
            }
        }
        break;

    case Js::OpCode::BrOnEmpty:
    case Js::OpCode::BrOnNotEmpty:
        Assert(dst->IsRegOpnd());
        Assert(dst->GetValueType().IsString());
        return this->NewGenericValue(ValueType::String, dst);

    case Js::OpCode::IsInst:
    case Js::OpCode::LdTrue:
    case Js::OpCode::LdFalse:
    case Js::OpCode::CmEq_A:
    case Js::OpCode::CmSrEq_A:
    case Js::OpCode::CmNeq_A:
    case Js::OpCode::CmSrNeq_A:
    case Js::OpCode::CmLe_A:
    case Js::OpCode::CmUnLe_A:
    case Js::OpCode::CmLt_A:
    case Js::OpCode::CmUnLt_A:
    case Js::OpCode::CmGe_A:
    case Js::OpCode::CmUnGe_A:
    case Js::OpCode::CmGt_A:
    case Js::OpCode::CmUnGt_A:
        return this->NewGenericValue(ValueType::Boolean, dst);

    case Js::OpCode::LdUndef:
        return this->NewGenericValue(ValueType::Undefined, dst);

    case Js::OpCode::LdC_A_Null:
        return this->NewGenericValue(ValueType::Null, dst);

    case Js::OpCode::LdThis:
        if (!PHASE_OFF(Js::OptTagChecksPhase, this->func) &&
            (src1ValueInfo == nullptr || src1ValueInfo->IsUninitialized()))
        {
            return this->NewGenericValue(ValueType::GetObject(ObjectType::Object).ToLikely().SetCanBeTaggedValue(false), dst);
        }
        break;

    case Js::OpCode::Typeof:
    case Js::OpCode::TypeofElem:
        return this->NewGenericValue(ValueType::String, dst);
    case Js::OpCode::InitLocalClosure:
        Assert(instr->GetDst());
        Assert(instr->GetDst()->IsRegOpnd());
        IR::RegOpnd *regOpnd = instr->GetDst()->AsRegOpnd();
        StackSym *opndStackSym = regOpnd->m_sym;
        Assert(opndStackSym != nullptr);
        ObjectSymInfo *objectSymInfo = opndStackSym->m_objectInfo;
        Assert(objectSymInfo != nullptr);
        for (PropertySym *localVarSlotList = objectSymInfo->m_propertySymList; localVarSlotList; localVarSlotList = localVarSlotList->m_nextInStackSymList)
        {
            this->slotSyms->Set(localVarSlotList->m_id);
        }
        break;
    }

    if (dstVal == nullptr)
    {
        return this->NewGenericValue(dst->GetValueType(), dst);
    }

    return CurrentBlockData()->SetValue(dstVal, dst);
}